

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O2

void decode_performance_tests(int loop_count)

{
  ostream *poVar1;
  size_t __n;
  long lVar2;
  long lVar3;
  int iVar4;
  bool bVar5;
  allocator_type local_fd;
  int local_fc;
  double local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_source;
  vector<unsigned_char,_std::allocator<unsigned_char>_> destination;
  jpegls_decoder decoder;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Test decode performance with loop count ");
  local_fc = loop_count;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,loop_count);
  std::operator<<(poVar1,"\n");
  read_file(&encoded_source,"decodetest.jls",0,0);
  charls::jpegls_decoder::
  jpegls_decoder<std::vector<unsigned_char,std::allocator<unsigned_char>>,unsigned_char>
            (&decoder,&encoded_source,true);
  __n = charls::jpegls_decoder::destination_size(&decoder,0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&destination,__n,&local_fd);
  charls::jpegls_decoder::~jpegls_decoder(&decoder);
  lVar2 = std::chrono::_V2::steady_clock::now();
  iVar4 = local_fc;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    charls::jpegls_decoder::
    jpegls_decoder<std::vector<unsigned_char,std::allocator<unsigned_char>>,unsigned_char>
              (&decoder,&encoded_source,true);
    charls::jpegls_decoder::
    decode<std::vector<unsigned_char,std::allocator<unsigned_char>>,unsigned_char>
              (&decoder,&destination,0);
    charls::jpegls_decoder::~jpegls_decoder(&decoder);
  }
  lVar3 = std::chrono::_V2::steady_clock::now();
  std::operator<<((ostream *)&std::cout,"Total decoding time is: ");
  local_f8 = (double)(lVar3 - lVar2) / 1000000.0;
  poVar1 = std::ostream::_M_insert<double>(local_f8);
  std::operator<<(poVar1," ms\n");
  std::operator<<((ostream *)&std::cout,"Decoding time per image: ");
  poVar1 = std::ostream::_M_insert<double>(local_f8 / (double)local_fc);
  std::operator<<(poVar1," ms\n");
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&destination.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&encoded_source.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void decode_performance_tests(const int loop_count)
{
    cout << "Test decode performance with loop count " << loop_count << "\n";

    try
    {
        // This test expect the file decodetest.jls to exist.
        // It can be any valid JPEG-LS file.
        // Changing the content of this file allows different performance measurements.
        const vector<uint8_t> encoded_source{read_file("decodetest.jls")};

        // Pre-allocate the destination outside the measurement loop.
        // std::vector initializes its elements and this step needs to be excluded from the measurement.
        vector<uint8_t> destination(jpegls_decoder{encoded_source, true}.destination_size());

        const auto start{steady_clock::now()};
        for (int i{}; i != loop_count; ++i)
        {
            const jpegls_decoder decoder{encoded_source, true};

            decoder.decode(destination);
        }

        const auto end{steady_clock::now()};
        const auto diff{end - start};
        cout << "Total decoding time is: " << duration<double, milli>(diff).count() << " ms\n";
        cout << "Decoding time per image: " << duration<double, milli>(diff).count() / loop_count << " ms\n";
    }
    catch (const jpegls_error& e)
    {
        cout << "Decode failure: " << e.what() << "\n";
    }
    catch (const std::ios_base::failure& e)
    {
        cout << "IO failure (missing decodetest.jls?): " << e.what() << "\n";
    }
}